

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void fprefx(obj *otmp)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *local_60;
  char *local_58;
  int x;
  obj *otmp_local;
  
  switch(otmp->otyp) {
  case 0x10d:
    if ((((youmonst.data)->mflags1 & 0x20000000) != 0) &&
       (((youmonst.data)->mflags1 & 0x20000) == 0)) {
      pline("That tripe ration was surprisingly good!");
      return;
    }
    if (u.umonnum == u.umonster) {
      if (urace.malenum != 0x4a) goto LAB_001c8ef1;
    }
    else if (((youmonst.data)->mflags2 & 0x80) == 0) {
LAB_001c8ef1:
      pline("Yak - dog food!");
      if (urole.malenum == 0x15d) {
        pline("At least it\'s not prison food.");
      }
      more_experienced(1,1,0);
      newexplevel();
      iVar3 = rn2(2);
      if (iVar3 == 0) {
        return;
      }
      if (urole.malenum == 0x15b) {
        return;
      }
      if (urace.malenum == 0x4a) {
        return;
      }
      if (urace.malenum == 0xe8) {
        return;
      }
      if (urole.malenum == 0x15d) {
        return;
      }
      iVar3 = rn2(victual.reqtime);
      make_vomiting((long)(iVar3 + 0xe),'\0');
      return;
    }
    bVar6 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar6 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
        bVar2 = dmgtype(youmonst.data,0x24);
        bVar6 = bVar2 != '\0';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    pcVar4 = "Mmm, tripe... not bad!";
    if (bVar6) {
      pcVar4 = "Tastes great! Less filling!";
    }
    pline(pcVar4);
    return;
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
    goto LAB_001c9277;
  case 0x11d:
    if (((youmonst.data)->mflags2 & 2) != 0) {
      iVar3 = rn2(victual.reqtime);
      make_vomiting((long)(iVar3 + 5),'\0');
      return;
    }
    break;
  case 0x126:
    if (u.uhunger < 0xc9) {
      bVar6 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar6 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
          bVar2 = dmgtype(youmonst.data,0x24);
          bVar6 = bVar2 != '\0';
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      pcVar4 = "That food really hit the spot!";
      if (bVar6) {
        pcVar4 = "Oh wow, like, superior, man!";
      }
      pline(pcVar4);
      return;
    }
    if (700 < u.uhunger) {
      return;
    }
    pcVar4 = body_part(0x12);
    pline("That satiated your %s!",pcVar4);
    return;
  }
  if (((otmp->otyp == 0x11e) && ((*(uint *)&otmp->field_0x4a & 1) == 0)) &&
     (otmp->spe == current_fruit)) {
    bVar6 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar6 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
        bVar2 = dmgtype(youmonst.data,0x24);
        bVar6 = bVar2 != '\0';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    pcVar4 = "yummy";
    if (bVar6) {
      pcVar4 = "primo";
    }
    pcVar5 = singular(otmp,xname);
    pline("My, that was a %s %s!",pcVar4,pcVar5);
  }
  else if ((otmp->otyp == 0x116) || (otmp->otyp == 0x118)) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pline("Core dumped.");
    }
    else {
      iVar3 = rnd(100);
      if (iVar3 < 0x4c) {
        pline("Segmentation fault -- core dumped.");
      }
      else if (iVar3 < 100) {
        pline("Bus error -- core dumped.");
      }
      else {
        pline("Yo\' mama -- core dumped.");
      }
    }
  }
  else if ((otmp->otyp == 0x10f) && (400 < moves - otmp->age)) {
    pline("Ugh.  Rotten egg.");
    if ((urole.malenum == 0x15d) && (iVar3 = rn2(8), u.ulevel < iVar3)) {
      pline("You feel a slight stomach ache.");
    }
    else {
      uVar1 = u.uprops[0x2f].intrinsic;
      iVar3 = dice(10,4);
      make_vomiting((ulong)(uVar1 + iVar3),'\x01');
    }
  }
  else {
LAB_001c9277:
    pcVar4 = singular(otmp,xname);
    if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
      if (((otmp->otyp == 0x125) || (otmp->otyp == 0x127)) || (otmp->otyp == 0x128)) {
        local_60 = "bland.";
      }
      else {
        bVar6 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar6 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
            bVar2 = dmgtype(youmonst.data,0x24);
            bVar6 = bVar2 != '\0';
          }
          bVar6 = (bool)(bVar6 ^ 1);
        }
        local_60 = "delicious!";
        if (bVar6) {
          local_60 = "gnarly!";
        }
      }
      local_58 = local_60;
    }
    else {
      bVar6 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar6 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
          bVar2 = dmgtype(youmonst.data,0x24);
          bVar6 = bVar2 != '\0';
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      local_58 = "terrible!";
      if (bVar6) {
        local_58 = "grody!";
      }
    }
    pline("This %s is %s",pcVar4,local_58);
  }
  return;
}

Assistant:

static void fprefx(struct obj *otmp)
{
	switch(otmp->otyp) {
	    case FOOD_RATION:
		if (u.uhunger <= 200)
		    pline(Hallucination ? "Oh wow, like, superior, man!" :
			  "That food really hit the spot!");
		else if (u.uhunger <= 700) pline("That satiated your %s!",
						body_part(STOMACH));
		break;
	    case TRIPE_RATION:
		if (carnivorous(youmonst.data) && !humanoid(youmonst.data))
		    pline("That tripe ration was surprisingly good!");
		else if (maybe_polyd(is_orc(youmonst.data), Race_if (PM_ORC)))
		    pline(Hallucination ? "Tastes great! Less filling!" :
			  "Mmm, tripe... not bad!");
		else {
		    pline("Yak - dog food!");
		    if (Role_if(PM_CONVICT))
			pline("At least it's not prison food.");
		    more_experienced(1, 1, 0);
		    newexplevel();
		    /* not cannibalism, but we use similar criteria
		       for deciding whether to be sickened by this meal */
		    if (rn2(2) && !CANNIBAL_ALLOWED() && !Role_if(PM_CONVICT))
			make_vomiting((long)rn1(victual.reqtime, 14), FALSE);
		}
		break;
	    case MEATBALL:
	    case MEAT_STICK:
	    case HUGE_CHUNK_OF_MEAT:
	    case MEAT_RING:
		goto give_feedback;
	     /* break; */
	    case CLOVE_OF_GARLIC:
		if (is_undead(youmonst.data)) {
			make_vomiting((long)rn1(victual.reqtime, 5), FALSE);
			break;
		}
		/* Fall through otherwise */
	    default:
		if (otmp->otyp==SLIME_MOLD && !otmp->cursed
			&& otmp->spe == current_fruit)
		    pline("My, that was a %s %s!",
			  Hallucination ? "primo" : "yummy",
			  singular(otmp, xname));
		else
#ifdef UNIX
		if (otmp->otyp == APPLE || otmp->otyp == PEAR) {
		    if (!Hallucination) pline("Core dumped.");
		    else {
/* This is based on an old Usenet joke, a fake a.out manual page */
			int x = rnd(100);
			if (x <= 75)
			    pline("Segmentation fault -- core dumped.");
			else if (x <= 99)
			    pline("Bus error -- core dumped.");
			else pline("Yo' mama -- core dumped.");
		    }
		} else
#endif
		if (otmp->otyp == EGG && stale_egg(otmp)) {
		    pline("Ugh.  Rotten egg.");	/* perhaps others like it */
		    /* prisoners are used to bad food */
		    if (Role_if(PM_CONVICT) && rn2(8) > u.ulevel)
			pline("You feel a slight stomach ache.");
		    else
			make_vomiting(Vomiting + dice(10,4), TRUE);
		} else
 give_feedback:
		    pline("This %s is %s", singular(otmp, xname),
		      otmp->cursed ? (Hallucination ? "grody!" : "terrible!") :
		      (otmp->otyp == CRAM_RATION
		      || otmp->otyp == K_RATION
		      || otmp->otyp == C_RATION)
		      ? "bland." :
		      Hallucination ? "gnarly!" : "delicious!");
		break;
	}
}